

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mip_level::convert(mip_level *this,pixel_format fmt,bool cook,pack_params *p)

{
  uint uVar1;
  color_quad_u8 cVar2;
  bool bVar3;
  int iVar4;
  component_flags new_flags;
  uint uVar5;
  uint new_height;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar6;
  image<crnlib::color_quad<unsigned_char,_int>_> *piVar7;
  color_quad<unsigned_char,_int> *pcVar8;
  mip_level *this_00;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_8c;
  uint uStack_88;
  uint8 g;
  color_quad_u8 c;
  uint x;
  uint y;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_78;
  image_u8 *pImage;
  image_u8 *local_60;
  image_u8 *pImg;
  image_u8 tmp_img;
  pack_params *p_local;
  bool cook_local;
  pixel_format fmt_local;
  mip_level *this_local;
  
  tmp_img.m_pixel_buf._8_8_ = p;
  iVar4 = pixel_format_helpers::is_dxt(fmt);
  if (iVar4 == 0) {
    image<crnlib::color_quad<unsigned_char,_int>_>::image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
    this_00 = this;
    local_60 = get_unpacked_image(this,(image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg,1);
    piVar7 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
             crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)this_00);
    local_78 = piVar7;
    new_flags = pixel_format_helpers::get_component_flags(fmt);
    image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags(piVar7,new_flags);
    piVar7 = local_78;
    uVar5 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(local_60);
    new_height = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_60);
    color_quad<unsigned_char,_int>::make_black();
    bVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::resize
                      (piVar7,uVar5,new_height,0xffffffff,(color_quad<unsigned_char,_int> *)&y);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      for (c.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                        )0x0; cVar2.field_0 = c.field_0,
          aVar6.m_u32 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_60),
          (uint)cVar2.field_0 < aVar6.m_u32;
          c.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      ((int)c.field_0 + 1)) {
        for (uStack_88 = 0; uVar1 = uStack_88,
            uVar5 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(local_60),
            uVar1 < uVar5; uStack_88 = uStack_88 + 1) {
          pcVar8 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                             (local_60,uStack_88,(uint)c.field_0);
          color_quad<unsigned_char,_int>::color_quad
                    ((color_quad<unsigned_char,_int> *)&local_8c.field_0,pcVar8);
          bVar3 = pixel_format_helpers::is_alpha_only(fmt);
          if ((!bVar3) ||
             (bVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::has_alpha(local_60), bVar3)) {
            bVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::is_grayscale(local_78);
            if (bVar3) {
              iVar4 = color_quad<unsigned_char,_int>::get_luma
                                ((color_quad<unsigned_char,_int> *)&local_8c.field_0);
              local_8c.field_0.r = (uchar)iVar4;
              local_8c.field_0.g = local_8c.field_0.r;
              local_8c.field_0.b = local_8c.field_0.r;
            }
            bVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid(local_78,3);
            if (!bVar3) {
              local_8c.field_0.a = 0xff;
            }
          }
          else {
            iVar4 = color_quad<unsigned_char,_int>::get_luma
                              ((color_quad<unsigned_char,_int> *)&local_8c.field_0);
            local_8c.field_0.a = (uchar)iVar4;
          }
          pcVar8 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                             (local_78,uStack_88,(uint)c.field_0);
          color_quad<unsigned_char,_int>::operator=
                    (pcVar8,(color_quad<unsigned_char,_int> *)&local_8c.field_0);
        }
      }
      assign(this,local_78,fmt,this->m_orient_flags);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
    image<crnlib::color_quad<unsigned_char,_int>_>::~image
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
  }
  else {
    this_local._7_1_ = pack_to_dxt(this,fmt,cook,(pack_params *)tmp_img.m_pixel_buf._8_8_);
  }
  return this_local._7_1_;
}

Assistant:

bool mip_level::convert(pixel_format fmt, bool cook, const dxt_image::pack_params& p) {
  if (pixel_format_helpers::is_dxt(fmt))
    return pack_to_dxt(fmt, cook, p);

  image_u8 tmp_img;
  image_u8* pImg = get_unpacked_image(tmp_img, cUnpackFlagUncook);

  image_u8* pImage = crnlib_new<image_u8>();
  pImage->set_comp_flags(pixel_format_helpers::get_component_flags(fmt));

  if (!pImage->resize(pImg->get_width(), pImg->get_height()))
    return false;

  for (uint y = 0; y < pImg->get_height(); y++) {
    for (uint x = 0; x < pImg->get_width(); x++) {
      color_quad_u8 c((*pImg)(x, y));

      if ((pixel_format_helpers::is_alpha_only(fmt)) && (!pImg->has_alpha())) {
        c.a = static_cast<uint8>(c.get_luma());
      } else {
        if (pImage->is_grayscale()) {
          uint8 g = static_cast<uint8>(c.get_luma());
          c.r = g;
          c.g = g;
          c.b = g;
        }

        if (!pImage->is_component_valid(3))
          c.a = 255;
      }

      (*pImage)(x, y) = c;
    }
  }

  assign(pImage, fmt, m_orient_flags);

  return true;
}